

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O1

void opj_tgt_reset(opj_tgt_tree_t *p_tree)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 *pOVar2;
  
  if ((p_tree != (opj_tgt_tree_t *)0x0) && (OVar1 = p_tree->numnodes, OVar1 != 0)) {
    pOVar2 = &p_tree->nodes->known;
    do {
      *(undefined8 *)(pOVar2 + -2) = 999;
      *pOVar2 = 0;
      pOVar2 = pOVar2 + 6;
      OVar1 = OVar1 - 1;
    } while (OVar1 != 0);
  }
  return;
}

Assistant:

void opj_tgt_reset(opj_tgt_tree_t *p_tree)
{
    OPJ_UINT32 i;
    opj_tgt_node_t * l_current_node = 00;;

    if (! p_tree) {
        return;
    }

    l_current_node = p_tree->nodes;
    for (i = 0; i < p_tree->numnodes; ++i) {
        l_current_node->value = 999;
        l_current_node->low = 0;
        l_current_node->known = 0;
        ++l_current_node;
    }
}